

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O0

void * ListFile_FromBuffer(LPBYTE pbBuffer,DWORD cbBuffer)

{
  PLISTFILE_CACHE p_Var1;
  PLISTFILE_CACHE pCache;
  DWORD cbBuffer_local;
  LPBYTE pbBuffer_local;
  
  p_Var1 = CreateListFileCache(cbBuffer);
  if (p_Var1 != (PLISTFILE_CACHE)0x0) {
    memcpy(p_Var1->pBegin,pbBuffer,(ulong)cbBuffer);
  }
  return p_Var1;
}

Assistant:

void * ListFile_FromBuffer(LPBYTE pbBuffer, DWORD cbBuffer)
{
    PLISTFILE_CACHE pCache = NULL;

    // Create the in-memory cache for the entire listfile
    // The listfile does not have any data loaded yet
    pCache = CreateListFileCache(cbBuffer);
    if(pCache != NULL)
        memcpy(pCache->pBegin, pbBuffer, cbBuffer);

    return pCache;
}